

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImGuiNextWindowData::ImGuiNextWindowData(ImGuiNextWindowData *this)

{
  ImVec2 local_38;
  ImRect local_30;
  ImVec2 local_20;
  ImVec2 local_18;
  ImGuiNextWindowData *local_10;
  ImGuiNextWindowData *this_local;
  
  local_10 = this;
  ImVec2::ImVec2(&this->PosVal);
  ImVec2::ImVec2(&this->PosPivotVal);
  ImVec2::ImVec2(&this->SizeVal);
  ImVec2::ImVec2(&this->ContentSizeVal);
  ImRect::ImRect(&this->SizeConstraintRect);
  ImVec2::ImVec2(&this->MenuBarOffsetMinVal);
  this->BgAlphaCond = 0;
  this->FocusCond = 0;
  this->SizeConstraintCond = 0;
  this->CollapsedCond = 0;
  this->ContentSizeCond = 0;
  this->SizeCond = 0;
  this->PosCond = 0;
  ImVec2::ImVec2(&local_18,0.0,0.0);
  this->SizeVal = local_18;
  this->PosPivotVal = this->SizeVal;
  this->PosVal = this->PosPivotVal;
  ImVec2::ImVec2(&local_20,0.0,0.0);
  this->ContentSizeVal = local_20;
  this->CollapsedVal = false;
  ImRect::ImRect(&local_30);
  (this->SizeConstraintRect).Min = local_30.Min;
  (this->SizeConstraintRect).Max = local_30.Max;
  this->SizeCallback = (ImGuiSizeCallback)0x0;
  this->SizeCallbackUserData = (void *)0x0;
  this->BgAlphaVal = 3.4028235e+38;
  ImVec2::ImVec2(&local_38,0.0,0.0);
  this->MenuBarOffsetMinVal = local_38;
  return;
}

Assistant:

ImGuiNextWindowData()
    {
        PosCond = SizeCond = ContentSizeCond = CollapsedCond = SizeConstraintCond = FocusCond = BgAlphaCond = 0;
        PosVal = PosPivotVal = SizeVal = ImVec2(0.0f, 0.0f);
        ContentSizeVal = ImVec2(0.0f, 0.0f);
        CollapsedVal = false;
        SizeConstraintRect = ImRect();
        SizeCallback = NULL;
        SizeCallbackUserData = NULL;
        BgAlphaVal = FLT_MAX;
        MenuBarOffsetMinVal = ImVec2(0.0f, 0.0f);
    }